

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  size_t sVar34;
  bool bVar35;
  uint uVar36;
  undefined4 uVar37;
  int iVar38;
  long lVar39;
  size_t sVar40;
  long lVar41;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar42;
  NodeRef root;
  long lVar43;
  uint uVar44;
  NodeRef *pNVar45;
  size_t i_1;
  long lVar46;
  ulong uVar47;
  float fVar48;
  vint4 ai_2;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  undefined1 in_ZMM0 [64];
  float fVar69;
  vint4 bi;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  vint4 bi_1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  vint4 bi_3;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  vint4 bi_2;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  vint4 ai;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar108;
  float fVar114;
  float fVar115;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar116;
  float fVar117;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar118;
  float fVar124;
  float fVar125;
  vint4 ai_1;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar126;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar139;
  vint4 ai_3;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar140 [64];
  uint uVar141;
  float fVar142;
  uint uVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar143;
  uint uVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  float fVar158;
  float fVar162;
  float fVar163;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar164;
  Precalculations pre;
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  undefined1 local_1a38 [16];
  undefined1 local_1a28 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_19e8 [8];
  float fStack_19e0;
  float fStack_19dc;
  undefined1 local_19d8 [16];
  Geometry *local_19c0;
  RayK<4> *local_19b8;
  uint local_19ac;
  vbool<4> terminated;
  undefined1 local_1998 [8];
  float fStack_1990;
  float fStack_198c;
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  undefined1 local_1968 [16];
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1928;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  uint local_18b8;
  uint uStack_18b4;
  uint uStack_18b0;
  uint uStack_18ac;
  uint uStack_18a8;
  uint uStack_18a4;
  uint uStack_18a0;
  uint uStack_189c;
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined8 local_1868;
  undefined8 uStack_1860;
  TravRayK<4,_false> tray;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar33 = mm_lookupmask_ps._248_8_;
  uVar32 = mm_lookupmask_ps._240_8_;
  uVar31 = mm_lookupmask_ps._8_8_;
  uVar30 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar82 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar57 = vpcmpeqd_avx(auVar82,(undefined1  [16])valid_i->field_0);
    auVar55 = ZEXT816(0) << 0x40;
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar55,5);
    auVar64 = auVar57 & auVar7;
    if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar64[0xf] < '\0')
    {
      auVar7 = vandps_avx(auVar7,auVar57);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar136._8_4_ = 0x7fffffff;
      auVar136._0_8_ = 0x7fffffff7fffffff;
      auVar136._12_4_ = 0x7fffffff;
      auVar57 = vandps_avx(auVar136,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar119._8_4_ = 0x219392ef;
      auVar119._0_8_ = 0x219392ef219392ef;
      auVar119._12_4_ = 0x219392ef;
      auVar57 = vcmpps_avx(auVar57,auVar119,1);
      auVar64 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar119,auVar57)
      ;
      auVar57 = vandps_avx(auVar136,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar57 = vcmpps_avx(auVar57,auVar119,1);
      auVar101 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar119,auVar57
                              );
      auVar57 = vandps_avx(auVar136,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar57 = vcmpps_avx(auVar57,auVar119,1);
      auVar57 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar119,auVar57)
      ;
      auVar98 = vrcpps_avx(auVar64);
      fVar66 = auVar98._0_4_;
      auVar94._0_4_ = auVar64._0_4_ * fVar66;
      fVar67 = auVar98._4_4_;
      auVar94._4_4_ = auVar64._4_4_ * fVar67;
      fVar68 = auVar98._8_4_;
      auVar94._8_4_ = auVar64._8_4_ * fVar68;
      fVar117 = auVar98._12_4_;
      auVar94._12_4_ = auVar64._12_4_ * fVar117;
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = 0x3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar64 = vsubps_avx(auVar120,auVar94);
      tray.rdir.field_0._0_4_ = fVar66 + fVar66 * auVar64._0_4_;
      tray.rdir.field_0._4_4_ = fVar67 + fVar67 * auVar64._4_4_;
      tray.rdir.field_0._8_4_ = fVar68 + fVar68 * auVar64._8_4_;
      tray.rdir.field_0._12_4_ = fVar117 + fVar117 * auVar64._12_4_;
      auVar64 = vrcpps_avx(auVar101);
      fVar66 = auVar64._0_4_;
      auVar98._0_4_ = auVar101._0_4_ * fVar66;
      fVar67 = auVar64._4_4_;
      auVar98._4_4_ = auVar101._4_4_ * fVar67;
      fVar68 = auVar64._8_4_;
      auVar98._8_4_ = auVar101._8_4_ * fVar68;
      fVar117 = auVar64._12_4_;
      auVar98._12_4_ = auVar101._12_4_ * fVar117;
      auVar64 = vsubps_avx(auVar120,auVar98);
      tray.rdir.field_0._16_4_ = fVar66 + fVar66 * auVar64._0_4_;
      tray.rdir.field_0._20_4_ = fVar67 + fVar67 * auVar64._4_4_;
      tray.rdir.field_0._24_4_ = fVar68 + fVar68 * auVar64._8_4_;
      tray.rdir.field_0._28_4_ = fVar117 + fVar117 * auVar64._12_4_;
      auVar64 = vrcpps_avx(auVar57);
      fVar66 = auVar64._0_4_;
      auVar101._0_4_ = auVar57._0_4_ * fVar66;
      fVar67 = auVar64._4_4_;
      auVar101._4_4_ = auVar57._4_4_ * fVar67;
      fVar68 = auVar64._8_4_;
      auVar101._8_4_ = auVar57._8_4_ * fVar68;
      fVar117 = auVar64._12_4_;
      auVar101._12_4_ = auVar57._12_4_ * fVar117;
      auVar57 = vsubps_avx(auVar120,auVar101);
      tray.rdir.field_0._32_4_ = fVar66 + fVar66 * auVar57._0_4_;
      tray.rdir.field_0._36_4_ = fVar67 + fVar67 * auVar57._4_4_;
      tray.rdir.field_0._40_4_ = fVar68 + fVar68 * auVar57._8_4_;
      tray.rdir.field_0._44_4_ = fVar117 + fVar117 * auVar57._12_4_;
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar55,1);
      auVar109._8_4_ = 0x10;
      auVar109._0_8_ = 0x1000000010;
      auVar109._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar57,auVar109);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar55,5);
      auVar64._8_4_ = 0x20;
      auVar64._0_8_ = 0x2000000020;
      auVar64._12_4_ = 0x20;
      auVar110._8_4_ = 0x30;
      auVar110._0_8_ = 0x3000000030;
      auVar110._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar110,auVar64,auVar57)
      ;
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar55,5);
      auVar102._8_4_ = 0x40;
      auVar102._0_8_ = 0x4000000040;
      auVar102._12_4_ = 0x40;
      auVar111._8_4_ = 0x50;
      auVar111._0_8_ = 0x5000000050;
      auVar111._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar111,auVar102,auVar57);
      auVar57 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar55);
      auVar64 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar55);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar140 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar57,auVar7);
      auVar84 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar57._8_4_ = 0xff800000;
      auVar57._0_8_ = 0xff800000ff800000;
      auVar57._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar57,auVar64,auVar7);
      terminated.field_0.i[1] = auVar7._4_4_ ^ auVar82._4_4_;
      terminated.field_0.i[0] = auVar7._0_4_ ^ auVar82._0_4_;
      terminated.field_0.i[2] = auVar7._8_4_ ^ auVar82._8_4_;
      terminated.field_0.i[3] = auVar7._12_4_ ^ auVar82._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar44 = 3;
      }
      else {
        uVar44 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_19b8 = ray + 0x80;
      pNVar45 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar42 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00ebc25b:
      do {
        do {
          root.ptr = pNVar45[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ebd43d;
          pNVar45 = pNVar45 + -1;
          paVar42 = paVar42 + -1;
          aVar143 = *paVar42;
          auVar82 = vcmpps_avx((undefined1  [16])aVar143,(undefined1  [16])tray.tfar.field_0,1);
          uVar36 = vmovmskps_avx(auVar82);
        } while (uVar36 == 0);
        uVar47 = (ulong)(uVar36 & 0xff);
        uVar36 = POPCOUNT(uVar36 & 0xff);
        if (uVar44 < uVar36) {
LAB_00ebc29a:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ebd43d;
              auVar82 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar143,6);
              if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar82 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar82[0xf]) goto LAB_00ebc25b;
              auVar82 = vpcmpeqd_avx(auVar82,auVar82);
              lVar39 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              lVar41 = 0;
              local_1988 = auVar82 ^ (undefined1  [16])terminated.field_0;
              goto LAB_00ebc487;
            }
            sVar40 = 8;
            aVar143 = auVar140._0_16_;
            for (lVar39 = 0;
                (lVar39 != 4 &&
                (sVar3 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar39 * 8), sVar3 != 8));
                lVar39 = lVar39 + 1) {
              uVar37 = *(undefined4 *)(root.ptr + 0x20 + lVar39 * 4);
              auVar49._4_4_ = uVar37;
              auVar49._0_4_ = uVar37;
              auVar49._8_4_ = uVar37;
              auVar49._12_4_ = uVar37;
              auVar21._8_8_ = tray.org.field_0._8_8_;
              auVar21._0_8_ = tray.org.field_0._0_8_;
              auVar22._8_8_ = tray.org.field_0._24_8_;
              auVar22._0_8_ = tray.org.field_0._16_8_;
              auVar23._8_8_ = tray.org.field_0._40_8_;
              auVar23._0_8_ = tray.org.field_0._32_8_;
              auVar82 = vsubps_avx(auVar49,auVar21);
              auVar103._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar82._0_4_;
              auVar103._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar82._4_4_;
              auVar103._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar82._8_4_;
              auVar103._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar82._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x40 + lVar39 * 4);
              auVar50._4_4_ = uVar37;
              auVar50._0_4_ = uVar37;
              auVar50._8_4_ = uVar37;
              auVar50._12_4_ = uVar37;
              auVar82 = vsubps_avx(auVar50,auVar22);
              auVar121._0_4_ = tray.rdir.field_0._16_4_ * auVar82._0_4_;
              auVar121._4_4_ = tray.rdir.field_0._20_4_ * auVar82._4_4_;
              auVar121._8_4_ = tray.rdir.field_0._24_4_ * auVar82._8_4_;
              auVar121._12_4_ = tray.rdir.field_0._28_4_ * auVar82._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x60 + lVar39 * 4);
              auVar51._4_4_ = uVar37;
              auVar51._0_4_ = uVar37;
              auVar51._8_4_ = uVar37;
              auVar51._12_4_ = uVar37;
              auVar82 = vsubps_avx(auVar51,auVar23);
              auVar137._0_4_ = tray.rdir.field_0._32_4_ * auVar82._0_4_;
              auVar137._4_4_ = tray.rdir.field_0._36_4_ * auVar82._4_4_;
              auVar137._8_4_ = tray.rdir.field_0._40_4_ * auVar82._8_4_;
              auVar137._12_4_ = tray.rdir.field_0._44_4_ * auVar82._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x30 + lVar39 * 4);
              auVar52._4_4_ = uVar37;
              auVar52._0_4_ = uVar37;
              auVar52._8_4_ = uVar37;
              auVar52._12_4_ = uVar37;
              auVar82 = vsubps_avx(auVar52,auVar21);
              auVar70._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar82._0_4_;
              auVar70._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar82._4_4_;
              auVar70._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar82._8_4_;
              auVar70._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar82._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x50 + lVar39 * 4);
              auVar53._4_4_ = uVar37;
              auVar53._0_4_ = uVar37;
              auVar53._8_4_ = uVar37;
              auVar53._12_4_ = uVar37;
              auVar82 = vsubps_avx(auVar53,auVar22);
              auVar85._0_4_ = tray.rdir.field_0._16_4_ * auVar82._0_4_;
              auVar85._4_4_ = tray.rdir.field_0._20_4_ * auVar82._4_4_;
              auVar85._8_4_ = tray.rdir.field_0._24_4_ * auVar82._8_4_;
              auVar85._12_4_ = tray.rdir.field_0._28_4_ * auVar82._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x70 + lVar39 * 4);
              auVar54._4_4_ = uVar37;
              auVar54._0_4_ = uVar37;
              auVar54._8_4_ = uVar37;
              auVar54._12_4_ = uVar37;
              auVar82 = vsubps_avx(auVar54,auVar23);
              auVar95._0_4_ = tray.rdir.field_0._32_4_ * auVar82._0_4_;
              auVar95._4_4_ = tray.rdir.field_0._36_4_ * auVar82._4_4_;
              auVar95._8_4_ = tray.rdir.field_0._40_4_ * auVar82._8_4_;
              auVar95._12_4_ = tray.rdir.field_0._44_4_ * auVar82._12_4_;
              auVar82 = vpminsd_avx(auVar103,auVar70);
              auVar57 = vpminsd_avx(auVar121,auVar85);
              auVar82 = vpmaxsd_avx(auVar82,auVar57);
              auVar57 = vpminsd_avx(auVar137,auVar95);
              auVar57 = vpmaxsd_avx(auVar82,auVar57);
              auVar82 = vpmaxsd_avx(auVar103,auVar70);
              auVar64 = vpmaxsd_avx(auVar121,auVar85);
              auVar64 = vpminsd_avx(auVar82,auVar64);
              auVar82 = vpmaxsd_avx(auVar137,auVar95);
              auVar64 = vpminsd_avx(auVar64,auVar82);
              auVar82 = vpmaxsd_avx(auVar57,(undefined1  [16])tray.tnear.field_0);
              auVar64 = vpminsd_avx(auVar64,(undefined1  [16])tray.tfar.field_0);
              auVar82 = vcmpps_avx(auVar82,auVar64,2);
              auVar84 = ZEXT1664(auVar82);
              sVar34 = sVar40;
              aVar6 = aVar143;
              if (((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar82[0xf] < '\0') &&
                 (aVar6.v = (__m128)vblendvps_avx(auVar140._0_16_,auVar57,auVar82), sVar34 = sVar3,
                 sVar40 != 8)) {
                pNVar45->ptr = sVar40;
                pNVar45 = pNVar45 + 1;
                *paVar42 = aVar143;
                paVar42 = paVar42 + 1;
              }
              aVar143 = aVar6;
              sVar40 = sVar34;
            }
            if (sVar40 == 8) goto LAB_00ebc421;
            auVar82 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar143,6);
            uVar37 = vmovmskps_avx(auVar82);
            root.ptr = sVar40;
          } while ((byte)uVar44 < (byte)POPCOUNT(uVar37));
          pNVar45->ptr = sVar40;
          pNVar45 = pNVar45 + 1;
          *paVar42 = aVar143;
          paVar42 = paVar42 + 1;
LAB_00ebc421:
          iVar38 = 4;
        }
        else {
          while (uVar47 != 0) {
            sVar40 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> sVar40 & 1) == 0; sVar40 = sVar40 + 1) {
              }
            }
            uVar47 = uVar47 & uVar47 - 1;
            auVar84 = ZEXT1664(auVar84._0_16_);
            bVar35 = occluded1(This,bvh,root,sVar40,&pre,ray,&tray,context);
            if (bVar35) {
              *(undefined4 *)(local_1998 + sVar40 * 4 + -0x10) = 0xffffffff;
            }
          }
          auVar82 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar38 = 3;
          auVar140 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar82[0xf] < '\0') {
            auVar84 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar82._8_4_ = 0xff800000;
            auVar82._0_8_ = 0xff800000ff800000;
            auVar82._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar82,
                               (undefined1  [16])terminated.field_0);
            iVar38 = 2;
          }
          if (uVar44 < uVar36) goto LAB_00ebc29a;
        }
      } while (iVar38 != 3);
LAB_00ebd43d:
      auVar7 = vandps_avx(auVar7,(undefined1  [16])terminated.field_0);
      auVar83._8_4_ = 0xff800000;
      auVar83._0_8_ = 0xff800000ff800000;
      auVar83._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar83);
      *(undefined1 (*) [16])local_19b8 = auVar7;
    }
  }
  return;
LAB_00ebc487:
  do {
    auVar82 = auVar84._0_16_;
    if (lVar41 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    lVar43 = lVar41 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    auVar84 = ZEXT1664(local_1988);
    lVar46 = 0;
    do {
      auVar57 = auVar84._0_16_;
      if (lVar46 == 4) break;
      uVar36 = *(uint *)(lVar39 + lVar46 * 4);
      if ((ulong)uVar36 == 0xffffffff) break;
      fVar66 = *(float *)(lVar39 + -0xc0 + lVar46 * 4);
      auVar55._4_4_ = fVar66;
      auVar55._0_4_ = fVar66;
      auVar55._8_4_ = fVar66;
      auVar55._12_4_ = fVar66;
      fVar67 = *(float *)(lVar39 + -0xb0 + lVar46 * 4);
      auVar71._4_4_ = fVar67;
      auVar71._0_4_ = fVar67;
      auVar71._8_4_ = fVar67;
      auVar71._12_4_ = fVar67;
      fVar68 = *(float *)(lVar39 + -0xa0 + lVar46 * 4);
      auVar86._4_4_ = fVar68;
      auVar86._0_4_ = fVar68;
      auVar86._8_4_ = fVar68;
      auVar86._12_4_ = fVar68;
      local_19e8._4_4_ = *(float *)(lVar39 + -0x90 + lVar46 * 4);
      local_1998._4_4_ = *(float *)(lVar39 + -0x80 + lVar46 * 4);
      fVar117 = *(float *)(lVar39 + -0x70 + lVar46 * 4);
      local_1968._4_4_ = *(undefined4 *)(lVar39 + -0x60 + lVar46 * 4);
      local_1968._0_4_ = local_1968._4_4_;
      local_1968._8_4_ = local_1968._4_4_;
      local_1968._12_4_ = local_1968._4_4_;
      local_1978._4_4_ = *(undefined4 *)(lVar39 + -0x50 + lVar46 * 4);
      local_1978._0_4_ = local_1978._4_4_;
      local_1978._8_4_ = local_1978._4_4_;
      local_1978._12_4_ = local_1978._4_4_;
      local_1a28._4_4_ = *(undefined4 *)(lVar39 + -0x40 + lVar46 * 4);
      local_1a28._0_4_ = local_1a28._4_4_;
      local_1a28._8_4_ = local_1a28._4_4_;
      local_1a28._12_4_ = local_1a28._4_4_;
      fVar48 = *(float *)(lVar39 + -0x30 + lVar46 * 4);
      fVar1 = *(float *)(lVar39 + -0x20 + lVar46 * 4);
      fVar2 = *(float *)(lVar39 + -0x10 + lVar46 * 4);
      local_1868 = *(undefined8 *)(lVar43 + 0xd0);
      uStack_1860 = *(undefined8 *)(lVar43 + 0xd8);
      local_1998._0_4_ = local_1998._4_4_;
      fStack_1990 = (float)local_1998._4_4_;
      fStack_198c = (float)local_1998._4_4_;
      fVar157 = fVar67 - (float)local_1998._4_4_;
      fVar69 = fVar68 - fVar117;
      fVar67 = fVar1 - fVar67;
      fVar68 = fVar2 - fVar68;
      local_19e8._0_4_ = local_19e8._4_4_;
      fStack_19e0 = (float)local_19e8._4_4_;
      fStack_19dc = (float)local_19e8._4_4_;
      fVar18 = fVar66 - (float)local_19e8._4_4_;
      fVar66 = fVar48 - fVar66;
      auVar82 = vsubps_avx(auVar55,*(undefined1 (*) [16])ray);
      auVar64 = vsubps_avx(auVar71,*(undefined1 (*) [16])(ray + 0x10));
      auVar55 = vsubps_avx(auVar86,*(undefined1 (*) [16])(ray + 0x20));
      fVar8 = *(float *)(ray + 0x50);
      fVar9 = *(float *)(ray + 0x54);
      fVar10 = *(float *)(ray + 0x58);
      fVar11 = *(float *)(ray + 0x5c);
      fVar12 = *(float *)(ray + 0x60);
      fVar13 = *(float *)(ray + 100);
      fVar14 = *(float *)(ray + 0x68);
      fVar15 = *(float *)(ray + 0x6c);
      fVar127 = auVar55._0_4_;
      auVar153._0_4_ = fVar127 * fVar8;
      fVar129 = auVar55._4_4_;
      auVar153._4_4_ = fVar129 * fVar9;
      fVar131 = auVar55._8_4_;
      auVar153._8_4_ = fVar131 * fVar10;
      fVar133 = auVar55._12_4_;
      auVar153._12_4_ = fVar133 * fVar11;
      fVar135 = auVar64._0_4_;
      auVar159._0_4_ = fVar135 * fVar12;
      fVar139 = auVar64._4_4_;
      auVar159._4_4_ = fVar139 * fVar13;
      fVar118 = auVar64._8_4_;
      auVar159._8_4_ = fVar118 * fVar14;
      fVar124 = auVar64._12_4_;
      auVar159._12_4_ = fVar124 * fVar15;
      auVar102 = vsubps_avx(auVar159,auVar153);
      fVar16 = *(float *)(ray + 0x40);
      fVar17 = *(float *)(ray + 0x44);
      fVar19 = *(float *)(ray + 0x48);
      fVar20 = *(float *)(ray + 0x4c);
      fVar108 = auVar82._0_4_;
      auVar154._0_4_ = fVar108 * fVar12;
      fVar114 = auVar82._4_4_;
      auVar154._4_4_ = fVar114 * fVar13;
      fVar115 = auVar82._8_4_;
      auVar154._8_4_ = fVar115 * fVar14;
      fVar116 = auVar82._12_4_;
      auVar154._12_4_ = fVar116 * fVar15;
      auVar160._0_4_ = fVar127 * fVar16;
      auVar160._4_4_ = fVar129 * fVar17;
      auVar160._8_4_ = fVar131 * fVar19;
      auVar160._12_4_ = fVar133 * fVar20;
      auVar109 = vsubps_avx(auVar160,auVar154);
      auVar161._0_4_ = fVar135 * fVar16;
      auVar161._4_4_ = fVar139 * fVar17;
      auVar161._8_4_ = fVar118 * fVar19;
      auVar161._12_4_ = fVar124 * fVar20;
      auVar104._0_4_ = fVar108 * fVar8;
      auVar104._4_4_ = fVar114 * fVar9;
      auVar104._8_4_ = fVar115 * fVar10;
      auVar104._12_4_ = fVar116 * fVar11;
      auVar110 = vsubps_avx(auVar104,auVar161);
      auVar82 = ZEXT416((uint)(fVar18 * fVar68 - fVar66 * fVar69));
      auVar64 = vshufps_avx(auVar82,auVar82,0);
      auVar82 = ZEXT416((uint)(fVar157 * fVar66 - fVar18 * fVar67));
      auVar55 = vshufps_avx(auVar82,auVar82,0);
      auVar111 = vpermilps_avx(ZEXT416((uint)(fVar69 * fVar67 - fVar157 * fVar68)),0);
      auVar99._0_4_ = auVar111._0_4_ * fVar16 + auVar64._0_4_ * fVar8 + auVar55._0_4_ * fVar12;
      auVar99._4_4_ = auVar111._4_4_ * fVar17 + auVar64._4_4_ * fVar9 + auVar55._4_4_ * fVar13;
      auVar99._8_4_ = auVar111._8_4_ * fVar19 + auVar64._8_4_ * fVar10 + auVar55._8_4_ * fVar14;
      auVar99._12_4_ = auVar111._12_4_ * fVar20 + auVar64._12_4_ * fVar11 + auVar55._12_4_ * fVar15;
      auVar101 = vshufps_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67),0);
      auVar98 = vshufps_avx(ZEXT416((uint)fVar68),ZEXT416((uint)fVar68),0);
      auVar94 = vshufps_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66),0);
      auVar72._8_4_ = 0x80000000;
      auVar72._0_8_ = 0x8000000080000000;
      auVar72._12_4_ = 0x80000000;
      auVar82 = vandps_avx(auVar99,auVar72);
      uVar141 = auVar82._0_4_;
      auVar73._0_4_ =
           (float)(uVar141 ^
                  (uint)(auVar94._0_4_ * auVar102._0_4_ +
                        auVar109._0_4_ * auVar101._0_4_ + auVar110._0_4_ * auVar98._0_4_));
      uVar144 = auVar82._4_4_;
      auVar73._4_4_ =
           (float)(uVar144 ^
                  (uint)(auVar94._4_4_ * auVar102._4_4_ +
                        auVar109._4_4_ * auVar101._4_4_ + auVar110._4_4_ * auVar98._4_4_));
      uVar146 = auVar82._8_4_;
      auVar73._8_4_ =
           (float)(uVar146 ^
                  (uint)(auVar94._8_4_ * auVar102._8_4_ +
                        auVar109._8_4_ * auVar101._8_4_ + auVar110._8_4_ * auVar98._8_4_));
      uVar148 = auVar82._12_4_;
      auVar73._12_4_ =
           (float)(uVar148 ^
                  (uint)(auVar94._12_4_ * auVar102._12_4_ +
                        auVar109._12_4_ * auVar101._12_4_ + auVar110._12_4_ * auVar98._12_4_));
      auVar82 = vcmpps_avx(auVar73,_DAT_01f45a50,5);
      auVar101 = auVar57 & auVar82;
      if ((((auVar101 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar101 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar101 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar101[0xf] < '\0') {
        auVar101 = vshufps_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),0);
        auVar98 = vpermilps_avx(ZEXT416((uint)fVar157),0);
        auVar94 = vpermilps_avx(ZEXT416((uint)fVar69),0);
        auVar82 = vandps_avx(auVar82,auVar57);
        auVar106._0_4_ =
             (float)(uVar141 ^
                    (uint)(auVar101._0_4_ * auVar102._0_4_ +
                          auVar109._0_4_ * auVar98._0_4_ + auVar110._0_4_ * auVar94._0_4_));
        auVar106._4_4_ =
             (float)(uVar144 ^
                    (uint)(auVar101._4_4_ * auVar102._4_4_ +
                          auVar109._4_4_ * auVar98._4_4_ + auVar110._4_4_ * auVar94._4_4_));
        auVar106._8_4_ =
             (float)(uVar146 ^
                    (uint)(auVar101._8_4_ * auVar102._8_4_ +
                          auVar109._8_4_ * auVar98._8_4_ + auVar110._8_4_ * auVar94._8_4_));
        auVar106._12_4_ =
             (float)(uVar148 ^
                    (uint)(auVar101._12_4_ * auVar102._12_4_ +
                          auVar109._12_4_ * auVar98._12_4_ + auVar110._12_4_ * auVar94._12_4_));
        auVar101 = vcmpps_avx(auVar106,_DAT_01f45a50,5);
        auVar98 = auVar82 & auVar101;
        local_1898 = auVar111;
        local_1888 = auVar64;
        local_1878 = auVar55;
        if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar98[0xf] < '\0') {
          auVar58._8_4_ = 0x7fffffff;
          auVar58._0_8_ = 0x7fffffff7fffffff;
          auVar58._12_4_ = 0x7fffffff;
          auVar98 = vandps_avx(auVar99,auVar58);
          auVar82 = vandps_avx(auVar101,auVar82);
          auVar101 = vsubps_avx(auVar98,auVar73);
          auVar101 = vcmpps_avx(auVar101,auVar106,5);
          auVar94 = auVar82 & auVar101;
          if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar94[0xf] < '\0') {
            auVar82 = vandps_avx(auVar101,auVar82);
            auVar59._0_4_ =
                 (float)(uVar141 ^
                        (uint)(auVar111._0_4_ * fVar108 +
                              fVar135 * auVar64._0_4_ + fVar127 * auVar55._0_4_));
            auVar59._4_4_ =
                 (float)(uVar144 ^
                        (uint)(auVar111._4_4_ * fVar114 +
                              fVar139 * auVar64._4_4_ + fVar129 * auVar55._4_4_));
            auVar59._8_4_ =
                 (float)(uVar146 ^
                        (uint)(auVar111._8_4_ * fVar115 +
                              fVar118 * auVar64._8_4_ + fVar131 * auVar55._8_4_));
            auVar59._12_4_ =
                 (float)(uVar148 ^
                        (uint)(auVar111._12_4_ * fVar116 +
                              fVar124 * auVar64._12_4_ + fVar133 * auVar55._12_4_));
            fVar66 = auVar98._0_4_;
            auVar77._0_4_ = fVar66 * *(float *)(ray + 0x30);
            fVar67 = auVar98._4_4_;
            auVar77._4_4_ = fVar67 * *(float *)(ray + 0x34);
            fVar68 = auVar98._8_4_;
            auVar77._8_4_ = fVar68 * *(float *)(ray + 0x38);
            fVar157 = auVar98._12_4_;
            auVar77._12_4_ = fVar157 * *(float *)(ray + 0x3c);
            auVar122._0_4_ = fVar66 * *(float *)(ray + 0x80);
            auVar122._4_4_ = fVar67 * *(float *)(ray + 0x84);
            auVar122._8_4_ = fVar68 * *(float *)(ray + 0x88);
            auVar122._12_4_ = fVar157 * *(float *)(ray + 0x8c);
            auVar101 = vcmpps_avx(auVar77,auVar59,1);
            auVar94 = vcmpps_avx(auVar59,auVar122,2);
            auVar101 = vandps_avx(auVar94,auVar101);
            auVar94 = auVar82 & auVar101;
            if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar94[0xf] < '\0') {
              auVar82 = vandps_avx(auVar82,auVar101);
              auVar101 = vcmpps_avx(auVar99,_DAT_01f45a50,4);
              auVar94 = auVar82 & auVar101;
              if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar94[0xf] < '\0') {
                auVar82 = vandps_avx(auVar101,auVar82);
                local_19c0 = (context->scene->geometries).items[uVar36].ptr;
                uVar141 = local_19c0->mask;
                auVar78._4_4_ = uVar141;
                auVar78._0_4_ = uVar141;
                auVar78._8_4_ = uVar141;
                auVar78._12_4_ = uVar141;
                auVar101 = vandps_avx(auVar78,*(undefined1 (*) [16])(ray + 0x90));
                auVar101 = vpcmpeqd_avx(auVar101,_DAT_01f45a50);
                auVar94 = auVar82 & ~auVar101;
                if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar94[0xf] < '\0') {
                  local_19ac = *(uint *)((long)&local_1868 + lVar46 * 4);
                  local_1a38 = vandnps_avx(auVar101,auVar82);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (local_19c0->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar82 = vrcpps_avx(auVar98);
                    fVar69 = auVar82._0_4_;
                    auVar112._0_4_ = fVar66 * fVar69;
                    fVar66 = auVar82._4_4_;
                    auVar112._4_4_ = fVar67 * fVar66;
                    fVar67 = auVar82._8_4_;
                    auVar112._8_4_ = fVar68 * fVar67;
                    fVar68 = auVar82._12_4_;
                    auVar112._12_4_ = fVar157 * fVar68;
                    auVar123._8_4_ = 0x3f800000;
                    auVar123._0_8_ = 0x3f8000003f800000;
                    auVar123._12_4_ = 0x3f800000;
                    auVar82 = vsubps_avx(auVar123,auVar112);
                    fVar69 = fVar69 + fVar69 * auVar82._0_4_;
                    fVar66 = fVar66 + fVar66 * auVar82._4_4_;
                    fVar67 = fVar67 + fVar67 * auVar82._8_4_;
                    fVar68 = fVar68 + fVar68 * auVar82._12_4_;
                    auVar97._0_4_ = fVar69 * auVar73._0_4_;
                    auVar97._4_4_ = fVar66 * auVar73._4_4_;
                    auVar97._8_4_ = fVar67 * auVar73._8_4_;
                    auVar97._12_4_ = fVar68 * auVar73._12_4_;
                    auVar82 = vminps_avx(auVar97,auVar123);
                    auVar80._0_4_ = fVar69 * auVar106._0_4_;
                    auVar80._4_4_ = fVar66 * auVar106._4_4_;
                    auVar80._8_4_ = fVar67 * auVar106._8_4_;
                    auVar80._12_4_ = fVar68 * auVar106._12_4_;
                    auVar101 = vminps_avx(auVar80,auVar123);
                    auVar98 = vsubps_avx(auVar123,auVar82);
                    auVar94 = vsubps_avx(auVar123,auVar101);
                    auVar25._8_8_ = uVar31;
                    auVar25._0_8_ = uVar30;
                    local_18d8 = vblendvps_avx(auVar82,auVar98,auVar25);
                    local_18e8 = vblendvps_avx(auVar101,auVar94,auVar25);
                    local_1898._0_8_ = auVar111._0_8_;
                    local_1898._8_8_ = auVar111._8_8_;
                    local_1928._0_8_ = local_1898._0_8_;
                    local_1928._8_8_ = local_1898._8_8_;
                    local_1888._0_8_ = auVar64._0_8_;
                    local_1888._8_8_ = auVar64._8_8_;
                    local_1928._16_8_ = local_1888._0_8_;
                    local_1928._24_8_ = local_1888._8_8_;
                    local_1878._0_8_ = auVar55._0_8_;
                    local_1878._8_8_ = auVar55._8_8_;
                    local_1928._32_8_ = local_1878._0_8_;
                    local_1928._40_8_ = local_1878._8_8_;
                    local_18f8 = CONCAT44(fVar66 * auVar59._4_4_,fVar69 * auVar59._0_4_);
                    uStack_18f0 = CONCAT44(fVar68 * auVar59._12_4_,fVar67 * auVar59._8_4_);
                    args.valid = (int *)&Ng;
                    args.geometryUserPtr = &t;
                    args.context = (RTCRayQueryContext *)&v;
                    args.ray = (RTCRayN *)&u;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                         *)&local_1928.field_0);
                    local_18c8 = vpshufd_avx(ZEXT416(uVar36),0);
                    local_18d8 = vshufps_avx(ZEXT416(local_19ac),ZEXT416(local_19ac),0);
                    local_1928._0_8_ = Ng.field_0._0_8_;
                    local_1928._8_8_ = Ng.field_0._8_8_;
                    local_1928._16_8_ = Ng.field_0._16_8_;
                    local_1928._24_8_ = Ng.field_0._24_8_;
                    local_18f8 = u.field_0._0_8_;
                    uStack_18f0 = u.field_0._8_8_;
                    vcmpps_avx(ZEXT1632(local_18c8),ZEXT1632(local_18c8),0xf);
                    uStack_18b4 = context->user->instID[0];
                    local_18b8 = uStack_18b4;
                    uStack_18b0 = uStack_18b4;
                    uStack_18ac = uStack_18b4;
                    uStack_18a8 = context->user->instPrimID[0];
                    uStack_18a4 = uStack_18a8;
                    uStack_18a0 = uStack_18a8;
                    uStack_189c = uStack_18a8;
                    auVar82 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar64 = vblendvps_avx(auVar82,(undefined1  [16])t.field_0,local_1a38);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar64;
                    args.valid = (int *)local_19d8;
                    args.geometryUserPtr = local_19c0->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_1928;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    local_19d8 = local_1a38;
                    if (local_19c0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*local_19c0->occlusionFilterN)(&args);
                    }
                    if (local_19d8 == (undefined1  [16])0x0) {
                      auVar64 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar64 = auVar64 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_19c0->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar55 = vpcmpeqd_avx(local_19d8,_DAT_01f45a50);
                      auVar64 = auVar55 ^ _DAT_01f46b70;
                      auVar90._8_4_ = 0xff800000;
                      auVar90._0_8_ = 0xff800000ff800000;
                      auVar90._12_4_ = 0xff800000;
                      auVar55 = vblendvps_avx(auVar90,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar55);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar55;
                    }
                    auVar64 = vpslld_avx(auVar64,0x1f);
                    local_1a38 = vpsrad_avx(auVar64,0x1f);
                    auVar82 = vblendvps_avx(auVar82,*(undefined1 (*) [16])local_19b8,auVar64);
                    *(undefined1 (*) [16])local_19b8 = auVar82;
                  }
                  auVar57 = vandnps_avx(local_1a38,auVar57);
                }
              }
            }
          }
        }
      }
      if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar57 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar57 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar57[0xf])
      {
        auVar140 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      auVar28._4_4_ = fVar48;
      auVar28._0_4_ = fVar48;
      auVar28._8_4_ = fVar48;
      auVar28._12_4_ = fVar48;
      auVar82 = vsubps_avx(local_1968,auVar28);
      auVar27._4_4_ = fVar1;
      auVar27._0_4_ = fVar1;
      auVar27._8_4_ = fVar1;
      auVar27._12_4_ = fVar1;
      auVar64 = vsubps_avx(local_1978,auVar27);
      auVar26._4_4_ = fVar2;
      auVar26._0_4_ = fVar2;
      auVar26._8_4_ = fVar2;
      auVar26._12_4_ = fVar2;
      auVar55 = vsubps_avx(local_1a28,auVar26);
      auVar101 = vsubps_avx(_local_19e8,local_1968);
      auVar98 = vsubps_avx(_local_1998,local_1978);
      auVar29._4_4_ = fVar117;
      auVar29._0_4_ = fVar117;
      auVar29._8_4_ = fVar117;
      auVar29._12_4_ = fVar117;
      auVar94 = vsubps_avx(auVar29,local_1a28);
      fVar66 = auVar64._0_4_;
      fVar158 = auVar94._0_4_;
      auVar56._0_4_ = fVar158 * fVar66;
      fVar1 = auVar64._4_4_;
      fVar162 = auVar94._4_4_;
      auVar56._4_4_ = fVar162 * fVar1;
      fVar8 = auVar64._8_4_;
      fVar163 = auVar94._8_4_;
      auVar56._8_4_ = fVar163 * fVar8;
      fVar13 = auVar64._12_4_;
      fVar164 = auVar94._12_4_;
      auVar56._12_4_ = fVar164 * fVar13;
      fVar67 = auVar55._0_4_;
      fVar142 = auVar98._0_4_;
      auVar74._0_4_ = fVar142 * fVar67;
      fVar2 = auVar55._4_4_;
      fVar145 = auVar98._4_4_;
      auVar74._4_4_ = fVar145 * fVar2;
      fVar9 = auVar55._8_4_;
      fVar147 = auVar98._8_4_;
      auVar74._8_4_ = fVar147 * fVar9;
      fVar14 = auVar55._12_4_;
      fVar149 = auVar98._12_4_;
      auVar74._12_4_ = fVar149 * fVar14;
      auVar64 = vsubps_avx(auVar74,auVar56);
      fVar68 = auVar101._0_4_;
      auVar75._0_4_ = fVar67 * fVar68;
      fVar157 = auVar101._4_4_;
      auVar75._4_4_ = fVar2 * fVar157;
      fVar10 = auVar101._8_4_;
      auVar75._8_4_ = fVar9 * fVar10;
      fVar15 = auVar101._12_4_;
      auVar75._12_4_ = fVar14 * fVar15;
      fVar117 = auVar82._0_4_;
      auVar87._0_4_ = fVar158 * fVar117;
      fVar69 = auVar82._4_4_;
      auVar87._4_4_ = fVar162 * fVar69;
      fVar11 = auVar82._8_4_;
      auVar87._8_4_ = fVar163 * fVar11;
      fVar16 = auVar82._12_4_;
      auVar87._12_4_ = fVar164 * fVar16;
      auVar55 = vsubps_avx(auVar87,auVar75);
      auVar88._0_4_ = fVar142 * fVar117;
      auVar88._4_4_ = fVar145 * fVar69;
      auVar88._8_4_ = fVar147 * fVar11;
      auVar88._12_4_ = fVar149 * fVar16;
      auVar105._0_4_ = fVar68 * fVar66;
      auVar105._4_4_ = fVar157 * fVar1;
      auVar105._8_4_ = fVar10 * fVar8;
      auVar105._12_4_ = fVar15 * fVar13;
      local_1928.field_0.z.field_0 = (vfloat_impl<4>)vsubps_avx(auVar105,auVar88);
      auVar82 = vsubps_avx(local_1968,*(undefined1 (*) [16])ray);
      auVar101 = vsubps_avx(local_1978,*(undefined1 (*) [16])(ray + 0x10));
      auVar98 = vsubps_avx(local_1a28,*(undefined1 (*) [16])(ray + 0x20));
      fVar19 = *(float *)(ray + 0x50);
      fVar20 = *(float *)(ray + 0x54);
      fVar108 = *(float *)(ray + 0x58);
      fVar114 = *(float *)(ray + 0x5c);
      fVar115 = *(float *)(ray + 0x60);
      fVar116 = *(float *)(ray + 100);
      fVar127 = *(float *)(ray + 0x68);
      fVar129 = *(float *)(ray + 0x6c);
      fVar48 = auVar98._0_4_;
      auVar150._0_4_ = fVar19 * fVar48;
      fVar18 = auVar98._4_4_;
      auVar150._4_4_ = fVar20 * fVar18;
      fVar12 = auVar98._8_4_;
      auVar150._8_4_ = fVar108 * fVar12;
      fVar17 = auVar98._12_4_;
      auVar150._12_4_ = fVar114 * fVar17;
      fVar128 = auVar101._0_4_;
      auVar151._0_4_ = fVar128 * fVar115;
      fVar130 = auVar101._4_4_;
      auVar151._4_4_ = fVar130 * fVar116;
      fVar132 = auVar101._8_4_;
      auVar151._8_4_ = fVar132 * fVar127;
      fVar134 = auVar101._12_4_;
      auVar151._12_4_ = fVar134 * fVar129;
      auVar101 = vsubps_avx(auVar151,auVar150);
      fVar131 = *(float *)(ray + 0x40);
      fVar133 = *(float *)(ray + 0x44);
      fVar135 = *(float *)(ray + 0x48);
      fVar139 = *(float *)(ray + 0x4c);
      fVar118 = auVar82._0_4_;
      auVar152._0_4_ = fVar118 * fVar115;
      fVar124 = auVar82._4_4_;
      auVar152._4_4_ = fVar124 * fVar116;
      fVar125 = auVar82._8_4_;
      auVar152._8_4_ = fVar125 * fVar127;
      fVar126 = auVar82._12_4_;
      auVar152._12_4_ = fVar126 * fVar129;
      auVar155._0_4_ = fVar48 * fVar131;
      auVar155._4_4_ = fVar18 * fVar133;
      auVar155._8_4_ = fVar12 * fVar135;
      auVar155._12_4_ = fVar17 * fVar139;
      auVar98 = vsubps_avx(auVar155,auVar152);
      auVar156._0_4_ = fVar128 * fVar131;
      auVar156._4_4_ = fVar130 * fVar133;
      auVar156._8_4_ = fVar132 * fVar135;
      auVar156._12_4_ = fVar134 * fVar139;
      auVar89._0_4_ = fVar19 * fVar118;
      auVar89._4_4_ = fVar20 * fVar124;
      auVar89._8_4_ = fVar108 * fVar125;
      auVar89._12_4_ = fVar114 * fVar126;
      auVar94 = vsubps_avx(auVar89,auVar156);
      local_1a58 = auVar64._0_4_;
      fStack_1a54 = auVar64._4_4_;
      fStack_1a50 = auVar64._8_4_;
      fStack_1a4c = auVar64._12_4_;
      auVar138._0_4_ = local_1a58 * fVar131 + fVar19 * auVar55._0_4_ + local_1928._32_4_ * fVar115;
      auVar138._4_4_ = fStack_1a54 * fVar133 + fVar20 * auVar55._4_4_ + local_1928._36_4_ * fVar116;
      auVar138._8_4_ = fStack_1a50 * fVar135 + fVar108 * auVar55._8_4_ + local_1928._40_4_ * fVar127
      ;
      auVar138._12_4_ =
           fStack_1a4c * fVar139 + fVar114 * auVar55._12_4_ + local_1928._44_4_ * fVar129;
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar82 = vandps_avx(auVar138,auVar76);
      uVar36 = auVar82._0_4_;
      auVar96._0_4_ =
           (float)(uVar36 ^ (uint)(auVar101._0_4_ * fVar68 +
                                  fVar142 * auVar98._0_4_ + fVar158 * auVar94._0_4_));
      uVar141 = auVar82._4_4_;
      auVar96._4_4_ =
           (float)(uVar141 ^
                  (uint)(auVar101._4_4_ * fVar157 +
                        fVar145 * auVar98._4_4_ + fVar162 * auVar94._4_4_));
      uVar144 = auVar82._8_4_;
      auVar96._8_4_ =
           (float)(uVar144 ^
                  (uint)(auVar101._8_4_ * fVar10 + fVar147 * auVar98._8_4_ + fVar163 * auVar94._8_4_
                        ));
      uVar146 = auVar82._12_4_;
      auVar96._12_4_ =
           (float)(uVar146 ^
                  (uint)(auVar101._12_4_ * fVar15 +
                        fVar149 * auVar98._12_4_ + fVar164 * auVar94._12_4_));
      auVar84 = ZEXT1664(auVar57);
      auVar82 = vcmpps_avx(auVar96,_DAT_01f45a50,5);
      auVar102 = auVar57 & auVar82;
      if ((((auVar102 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar102 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar102 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar102[0xf] < '\0') {
        auVar82 = vandps_avx(auVar82,auVar57);
        auVar100._0_4_ =
             (float)(uVar36 ^ (uint)(auVar101._0_4_ * fVar117 +
                                    auVar98._0_4_ * fVar66 + fVar67 * auVar94._0_4_));
        auVar100._4_4_ =
             (float)(uVar141 ^
                    (uint)(auVar101._4_4_ * fVar69 + auVar98._4_4_ * fVar1 + fVar2 * auVar94._4_4_))
        ;
        auVar100._8_4_ =
             (float)(uVar144 ^
                    (uint)(auVar101._8_4_ * fVar11 + auVar98._8_4_ * fVar8 + fVar9 * auVar94._8_4_))
        ;
        auVar100._12_4_ =
             (float)(uVar146 ^
                    (uint)(auVar101._12_4_ * fVar16 +
                          auVar98._12_4_ * fVar13 + fVar14 * auVar94._12_4_));
        auVar101 = vcmpps_avx(auVar100,_DAT_01f45a50,5);
        auVar98 = auVar82 & auVar101;
        if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar98[0xf] < '\0') {
          auVar60._8_4_ = 0x7fffffff;
          auVar60._0_8_ = 0x7fffffff7fffffff;
          auVar60._12_4_ = 0x7fffffff;
          auVar98 = vandps_avx(auVar138,auVar60);
          auVar82 = vandps_avx(auVar101,auVar82);
          auVar101 = vsubps_avx(auVar98,auVar96);
          auVar101 = vcmpps_avx(auVar101,auVar100,5);
          auVar94 = auVar82 & auVar101;
          if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar94[0xf] < '\0') {
            auVar82 = vandps_avx(auVar101,auVar82);
            auVar107._0_4_ =
                 (float)(uVar36 ^ (uint)(local_1a58 * fVar118 +
                                        fVar128 * auVar55._0_4_ + fVar48 * local_1928._32_4_));
            auVar107._4_4_ =
                 (float)(uVar141 ^
                        (uint)(fStack_1a54 * fVar124 +
                              fVar130 * auVar55._4_4_ + fVar18 * local_1928._36_4_));
            auVar107._8_4_ =
                 (float)(uVar144 ^
                        (uint)(fStack_1a50 * fVar125 +
                              fVar132 * auVar55._8_4_ + fVar12 * local_1928._40_4_));
            auVar107._12_4_ =
                 (float)(uVar146 ^
                        (uint)(fStack_1a4c * fVar126 +
                              fVar134 * auVar55._12_4_ + fVar17 * local_1928._44_4_));
            fVar66 = auVar98._0_4_;
            auVar61._0_4_ = fVar66 * *(float *)(ray + 0x30);
            fVar67 = auVar98._4_4_;
            auVar61._4_4_ = fVar67 * *(float *)(ray + 0x34);
            fVar68 = auVar98._8_4_;
            auVar61._8_4_ = fVar68 * *(float *)(ray + 0x38);
            fVar117 = auVar98._12_4_;
            auVar61._12_4_ = fVar117 * *(float *)(ray + 0x3c);
            auVar79._0_4_ = fVar66 * *(float *)(ray + 0x80);
            auVar79._4_4_ = fVar67 * *(float *)(ray + 0x84);
            auVar79._8_4_ = fVar68 * *(float *)(ray + 0x88);
            auVar79._12_4_ = fVar117 * *(float *)(ray + 0x8c);
            auVar101 = vcmpps_avx(auVar61,auVar107,1);
            auVar94 = vcmpps_avx(auVar107,auVar79,2);
            auVar101 = vandps_avx(auVar94,auVar101);
            auVar94 = auVar82 & auVar101;
            if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar94[0xf] < '\0') {
              auVar82 = vandps_avx(auVar82,auVar101);
              auVar101 = vcmpps_avx(auVar138,_DAT_01f45a50,4);
              auVar94 = auVar82 & auVar101;
              if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar94[0xf] < '\0') {
                auVar82 = vandps_avx(auVar101,auVar82);
                uVar141 = *(uint *)(lVar39 + lVar46 * 4);
                pGVar4 = (context->scene->geometries).items[uVar141].ptr;
                uVar36 = pGVar4->mask;
                auVar62._4_4_ = uVar36;
                auVar62._0_4_ = uVar36;
                auVar62._8_4_ = uVar36;
                auVar62._12_4_ = uVar36;
                auVar101 = vandps_avx(auVar62,*(undefined1 (*) [16])(ray + 0x90));
                auVar101 = vpcmpeqd_avx(auVar101,_DAT_01f45a50);
                auVar94 = auVar82 & ~auVar101;
                if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar94[0xf] < '\0') {
                  uVar36 = *(uint *)((long)&local_1868 + lVar46 * 4);
                  local_1a28 = vandnps_avx(auVar101,auVar82);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar82 = vrcpps_avx(auVar98);
                    fVar48 = auVar82._0_4_;
                    auVar81._0_4_ = fVar66 * fVar48;
                    fVar66 = auVar82._4_4_;
                    auVar81._4_4_ = fVar67 * fVar66;
                    fVar67 = auVar82._8_4_;
                    auVar81._8_4_ = fVar68 * fVar67;
                    fVar68 = auVar82._12_4_;
                    auVar81._12_4_ = fVar117 * fVar68;
                    auVar113._8_4_ = 0x3f800000;
                    auVar113._0_8_ = 0x3f8000003f800000;
                    auVar113._12_4_ = 0x3f800000;
                    auVar82 = vsubps_avx(auVar113,auVar81);
                    fVar48 = fVar48 + fVar48 * auVar82._0_4_;
                    fVar66 = fVar66 + fVar66 * auVar82._4_4_;
                    fVar67 = fVar67 + fVar67 * auVar82._8_4_;
                    fVar68 = fVar68 + fVar68 * auVar82._12_4_;
                    auVar91._0_4_ = fVar48 * auVar96._0_4_;
                    auVar91._4_4_ = fVar66 * auVar96._4_4_;
                    auVar91._8_4_ = fVar67 * auVar96._8_4_;
                    auVar91._12_4_ = fVar68 * auVar96._12_4_;
                    auVar82 = vminps_avx(auVar91,auVar113);
                    auVar63._0_4_ = fVar48 * auVar100._0_4_;
                    auVar63._4_4_ = fVar66 * auVar100._4_4_;
                    auVar63._8_4_ = fVar67 * auVar100._8_4_;
                    auVar63._12_4_ = fVar68 * auVar100._12_4_;
                    auVar101 = vminps_avx(auVar63,auVar113);
                    auVar98 = vsubps_avx(auVar113,auVar82);
                    auVar94 = vsubps_avx(auVar113,auVar101);
                    auVar24._8_8_ = uVar33;
                    auVar24._0_8_ = uVar32;
                    local_18d8 = vblendvps_avx(auVar82,auVar98,auVar24);
                    local_18e8 = vblendvps_avx(auVar101,auVar94,auVar24);
                    local_1928._0_8_ = auVar64._0_8_;
                    local_1928._8_8_ = auVar64._8_8_;
                    local_1968._0_8_ = auVar55._0_8_;
                    local_1968._8_8_ = auVar55._8_8_;
                    local_1928._16_8_ = local_1968._0_8_;
                    local_1928._24_8_ = local_1968._8_8_;
                    local_18f8 = CONCAT44(fVar66 * auVar107._4_4_,fVar48 * auVar107._0_4_);
                    uStack_18f0 = CONCAT44(fVar68 * auVar107._12_4_,fVar67 * auVar107._8_4_);
                    args.valid = (int *)&Ng;
                    args.geometryUserPtr = &t;
                    args.context = (RTCRayQueryContext *)&v;
                    args.ray = (RTCRayN *)&u;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                         *)&local_1928.field_0);
                    local_18c8 = vpshufd_avx(ZEXT416(uVar141),0);
                    auVar82 = ZEXT416(uVar36);
                    local_18d8 = vshufps_avx(auVar82,auVar82,0);
                    local_1928._0_8_ = Ng.field_0._0_8_;
                    local_1928._8_8_ = Ng.field_0._8_8_;
                    local_1928._16_8_ = Ng.field_0._16_8_;
                    local_1928._24_8_ = Ng.field_0._24_8_;
                    local_18f8 = u.field_0._0_8_;
                    uStack_18f0 = u.field_0._8_8_;
                    vcmpps_avx(ZEXT1632(local_18c8),ZEXT1632(local_18c8),0xf);
                    uStack_18b4 = context->user->instID[0];
                    local_18b8 = uStack_18b4;
                    uStack_18b0 = uStack_18b4;
                    uStack_18ac = uStack_18b4;
                    uStack_18a8 = context->user->instPrimID[0];
                    uStack_18a4 = uStack_18a8;
                    uStack_18a0 = uStack_18a8;
                    uStack_189c = uStack_18a8;
                    auVar82 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar64 = vblendvps_avx(auVar82,(undefined1  [16])t.field_0,local_1a28);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar64;
                    args.valid = (int *)local_19d8;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_1928;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    local_19d8 = local_1a28;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&args);
                    }
                    if (local_19d8 == (undefined1  [16])0x0) {
                      auVar64 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar64 = auVar64 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar55 = vpcmpeqd_avx(local_19d8,_DAT_01f45a50);
                      auVar64 = auVar55 ^ _DAT_01f46b70;
                      auVar92._8_4_ = 0xff800000;
                      auVar92._0_8_ = 0xff800000ff800000;
                      auVar92._12_4_ = 0xff800000;
                      auVar55 = vblendvps_avx(auVar92,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar55);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar55;
                    }
                    auVar64 = vpslld_avx(auVar64,0x1f);
                    local_1a28 = vpsrad_avx(auVar64,0x1f);
                    auVar82 = vblendvps_avx(auVar82,*(undefined1 (*) [16])local_19b8,auVar64);
                    *(undefined1 (*) [16])local_19b8 = auVar82;
                  }
                  auVar57 = vandnps_avx(local_1a28,auVar57);
                }
              }
            }
            auVar84 = ZEXT1664(auVar57);
            goto LAB_00ebc7ff;
          }
        }
        auVar84 = ZEXT1664(auVar57);
      }
LAB_00ebc7ff:
      lVar46 = lVar46 + 1;
      auVar57 = auVar84._0_16_;
      auVar140 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    } while ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar84[0xf] < '\0');
    auVar84 = ZEXT1664(local_1988);
    auVar64 = vandps_avx(auVar57,local_1988);
    lVar41 = lVar41 + 1;
    lVar39 = lVar39 + 0xe0;
    auVar57 = local_1988 & auVar57;
    auVar82 = local_1988;
    local_1988 = auVar64;
  } while ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar57[0xf] < '\0');
  auVar82 = vpcmpeqd_avx(auVar82,auVar82);
  auVar65._0_4_ = local_1988._0_4_ ^ auVar82._0_4_;
  auVar65._4_4_ = local_1988._4_4_ ^ auVar82._4_4_;
  auVar65._8_4_ = local_1988._8_4_ ^ auVar82._8_4_;
  auVar65._12_4_ = local_1988._12_4_ ^ auVar82._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar65,(undefined1  [16])terminated.field_0);
  auVar82 = auVar82 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar82 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar82[0xf])
  goto LAB_00ebd43d;
  auVar84 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar93._8_4_ = 0xff800000;
  auVar93._0_8_ = 0xff800000ff800000;
  auVar93._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar93,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00ebc25b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }